

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too)

{
  int iVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  option *poVar6;
  size_t __n;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  __s = place;
  iVar1 = optind;
  optind = optind + 1;
  pcVar3 = strchr(place,0x3d);
  if (pcVar3 == (char *)0x0) {
    __n = strlen(__s);
    pcVar3 = (char *)0x0;
  }
  else {
    __n = (long)pcVar3 - (long)__s;
    pcVar3 = pcVar3 + 1;
  }
  pcVar5 = long_options->name;
  if (pcVar5 == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    poVar6 = long_options + 1;
    iVar7 = -1;
    iVar8 = 0;
    do {
      iVar2 = strncmp(__s,pcVar5,__n);
      if (iVar2 == 0) {
        sVar4 = strlen(pcVar5);
        iVar2 = iVar8;
        if (sVar4 == __n) break;
        if ((__n != 1 || short_too == 0) && (bVar9 = iVar7 != -1, iVar7 = iVar8, bVar9)) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("ambiguous option -- %.*s",__n & 0xffffffff,__s);
          }
          goto LAB_001088ae;
        }
      }
      pcVar5 = poVar6->name;
      iVar8 = iVar8 + 1;
      poVar6 = poVar6 + 1;
      iVar2 = iVar7;
    } while (pcVar5 != (char *)0x0);
  }
  if (iVar2 == -1) {
    if (short_too == 0) {
      if ((opterr != 0) && (*options != ':')) {
        warnx("unknown option -- %s",__s);
      }
LAB_001088ae:
      optopt = 0;
      iVar2 = 0x3f;
    }
    else {
      iVar2 = -1;
      optind = iVar1;
    }
  }
  else {
    iVar7 = long_options[iVar2].has_arg;
    if (pcVar3 == (char *)0x0 || iVar7 != 0) {
      pcVar5 = optarg;
      if (((iVar7 - 1U < 2) && (pcVar5 = pcVar3, pcVar3 == (char *)0x0)) &&
         (pcVar5 = optarg, iVar7 == 1)) {
        optind = iVar1 + 2;
        pcVar5 = nargv[(long)iVar1 + 1];
      }
      optarg = pcVar5;
      if ((long_options[iVar2].has_arg != 1) || (optarg != (char *)0x0)) {
        if (idx != (int *)0x0) {
          *idx = iVar2;
        }
        if (long_options[iVar2].flag == (int *)0x0) {
          return long_options[iVar2].val;
        }
        *long_options[iVar2].flag = long_options[iVar2].val;
        return 0;
      }
      if ((opterr != 0) && (*options != ':')) {
        warnx("option requires an argument -- %s",__s);
      }
      optopt = 0;
      if (long_options[iVar2].flag == (int *)0x0) {
        optopt = long_options[iVar2].val;
      }
      optind = optind + -1;
    }
    else {
      if ((opterr != 0) && (*options != ':')) {
        warnx("option doesn\'t take an argument -- %.*s",__n & 0xffffffff,__s);
      }
      optopt = 0;
      if (long_options[iVar2].flag == (int *)0x0) {
        optopt = long_options[iVar2].val;
      }
    }
    iVar2 = (uint)(*options != ':') * 5 + 0x3a;
  }
  return iVar2;
}

Assistant:

static int
parse_long_options(char * const * nargv, const char * options,
				   const struct option * long_options, int * idx, int short_too) {
	char * current_argv, *has_equal;
	size_t current_argv_len;
	int i, match;

	current_argv = place;
	match = -1;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = has_equal - current_argv;
		has_equal++;
	} else {
		current_argv_len = strlen(current_argv);
	}

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
					current_argv_len)) {
			continue;
		}

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			break;
		}

		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1) {
			continue;
		}

		if (match == -1) {	/* partial match */
			match = i;
		} else {
			/* ambiguous abbreviation */
			if (PRINT_ERROR)
				warnx(ambig, (int)current_argv_len,
					  current_argv);

			optopt = 0;
			return (BADCH);
		}
	}

	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
				&& has_equal) {
			if (PRINT_ERROR)
				warnx(noarg, (int)current_argv_len,
					  current_argv);

			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL) {
				optopt = long_options[match].val;
			} else {
				optopt = 0;
			}

			return (BADARG);
		}

		if (long_options[match].has_arg == required_argument ||
				long_options[match].has_arg == optional_argument) {
			if (has_equal) {
				optarg = has_equal;
			} else if (long_options[match].has_arg ==
					   required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}

		if ((long_options[match].has_arg == required_argument)
				&& (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
					  current_argv);

			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL) {
				optopt = long_options[match].val;
			} else {
				optopt = 0;
			}

			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}

		if (PRINT_ERROR) {
			warnx(illoptstring, current_argv);
		}

		optopt = 0;
		return (BADCH);
	}

	if (idx) {
		*idx = match;
	}

	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else {
		return (long_options[match].val);
	}
}